

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationBuilder::insertNodeBetween
          (CollationBuilder *this,int32_t index,int32_t nextIndex,int64_t node,UErrorCode *errorCode
          )

{
  UVector64 *this_00;
  int iVar1;
  int iVar2;
  UBool UVar3;
  ulong uVar4;
  int iVar5;
  
  iVar5 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = &this->nodes;
    iVar1 = (this->nodes).count;
    if (((-2 < (long)iVar1) && (iVar1 < (this->nodes).capacity)) ||
       (UVar3 = UVector64::expandCapacity(this_00,iVar1 + 1,errorCode), UVar3 != '\0')) {
      iVar2 = (this->nodes).count;
      (this->nodes).elements[iVar2] = (long)index << 0x1c | node | (long)(nextIndex << 8);
      (this->nodes).count = iVar2 + 1;
    }
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar4 = 0;
      if ((-1 < index) && (index < (this->nodes).count)) {
        uVar4 = (this->nodes).elements[(uint)index] & 0xfffffffff00000ff;
      }
      UVector64::setElementAt(this_00,(long)(iVar1 << 8) | uVar4,index);
      iVar5 = iVar1;
      if (nextIndex != 0) {
        uVar4 = 0;
        if ((-1 < nextIndex) && (nextIndex < (this->nodes).count)) {
          uVar4 = (this->nodes).elements[(uint)nextIndex] & 0xffff00000fffffff;
        }
        UVector64::setElementAt(this_00,(long)iVar1 << 0x1c | uVar4,nextIndex);
      }
    }
  }
  return iVar5;
}

Assistant:

int32_t
CollationBuilder::insertNodeBetween(int32_t index, int32_t nextIndex, int64_t node,
                                    UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    U_ASSERT(previousIndexFromNode(node) == 0);
    U_ASSERT(nextIndexFromNode(node) == 0);
    U_ASSERT(nextIndexFromNode(nodes.elementAti(index)) == nextIndex);
    // Append the new node and link it to the existing nodes.
    int32_t newIndex = nodes.size();
    node |= nodeFromPreviousIndex(index) | nodeFromNextIndex(nextIndex);
    nodes.addElement(node, errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    // nodes[index].nextIndex = newIndex
    node = nodes.elementAti(index);
    nodes.setElementAt(changeNodeNextIndex(node, newIndex), index);
    // nodes[nextIndex].previousIndex = newIndex
    if(nextIndex != 0) {
        node = nodes.elementAti(nextIndex);
        nodes.setElementAt(changeNodePreviousIndex(node, newIndex), nextIndex);
    }
    return newIndex;
}